

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

double bsc_costs_std_root_p_tree_put(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (group == (bsc_group_t)0x0) {
    iVar1 = bsp_nprocs();
  }
  else {
    iVar1 = *group;
  }
  dVar4 = (double)iVar1;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = ceil(dVar4);
  uVar3 = 0;
  dVar5 = bsc_L(BSC_PUT);
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x30 - uVar3 != 0; uVar3 = uVar3 + 0x30) {
    dVar6 = bsc_g(BSC_PUT,*(int *)((long)&set->size + uVar3));
    dVar5 = dVar5 + (double)*(int *)((long)&set->size + uVar3) * dVar6 * (double)((int)dVar4 + -1);
  }
  return dVar5 + dVar5;
}

Assistant:

double bsc_costs_std_root_p_tree_put(  bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_pid_t root_P = (bsc_pid_t) ceil(sqrt(P));
    double one_phase = bsc_L(BSC_PUT); 
    for ( i = 0; i < n ; ++i )
        one_phase += (root_P - 1) * bsc_g(BSC_PUT, set[i].size) * set[i].size;

    return 2*one_phase;
}